

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::optimizeBoolean(OptimizeInstructions *this,Expression *boolean)

{
  Id IVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  uint uVar5;
  int32_t iVar6;
  BinaryOp BVar7;
  Index bits;
  Expression *pEVar8;
  Expression **ppEVar9;
  ulong index;
  Literal *pLVar10;
  Literal local_78;
  Literal local_60;
  Literal local_48;
  
  IVar1 = boolean->_id;
  if (boolean != (Expression *)0x0 && IVar1 == UnaryId) {
    if (*(int *)(boolean + 1) != 0x14) {
      return boolean;
    }
    pEVar8 = (Expression *)boolean[1].type.id;
    if (pEVar8->_id == BinaryId) {
      BVar7 = invertBinaryOp(this,*(BinaryOp *)(pEVar8 + 1));
      if (BVar7 == InvalidBinary) {
        return boolean;
      }
      *(BinaryOp *)(pEVar8 + 1) = BVar7;
      return pEVar8;
    }
    if (pEVar8->_id != UnaryId) {
      return boolean;
    }
    if (*(int *)(pEVar8 + 1) != 0x14) {
      return boolean;
    }
    return (Expression *)pEVar8[1].type.id;
  }
  if (IVar1 != BinaryId || boolean == (Expression *)0x0) {
    if (IVar1 == BlockId && boolean != (Expression *)0x0) {
      if ((boolean->type).id != 2) {
        return boolean;
      }
      if (boolean[2].type.id == 0) {
        return boolean;
      }
      ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (boolean + 2));
      pEVar8 = optimizeBoolean(this,*ppEVar9);
      ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (boolean + 2));
      *ppEVar9 = pEVar8;
      return boolean;
    }
    if (IVar1 == IfId && boolean != (Expression *)0x0) {
      if ((boolean->type).id != 2) {
        return boolean;
      }
      pEVar8 = optimizeBoolean(this,(Expression *)boolean[1].type.id);
      boolean[1].type.id = (uintptr_t)pEVar8;
      pEVar8 = optimizeBoolean(this,*(Expression **)(boolean + 2));
      *(Expression **)(boolean + 2) = pEVar8;
      return boolean;
    }
    if (IVar1 != SelectId || boolean == (Expression *)0x0) {
      if (IVar1 != TryId || boolean == (Expression *)0x0) {
        return boolean;
      }
      if ((boolean->type).id != 2) {
        return boolean;
      }
      pEVar8 = optimizeBoolean(this,*(Expression **)(boolean + 2));
      *(Expression **)(boolean + 2) = pEVar8;
      for (uVar5 = 0; index = (ulong)uVar5, index < *(ulong *)(boolean + 5); uVar5 = uVar5 + 1) {
        ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )&boolean[4].type,index);
        pEVar8 = optimizeBoolean(this,*ppEVar9);
        ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )&boolean[4].type,index);
        *ppEVar9 = pEVar8;
      }
      return boolean;
    }
    pEVar8 = optimizeBoolean(this,*(Expression **)(boolean + 1));
    *(Expression **)(boolean + 1) = pEVar8;
    pEVar8 = optimizeBoolean(this,(Expression *)boolean[1].type.id);
    boolean[1].type.id = (uintptr_t)pEVar8;
    return boolean;
  }
  iVar2 = *(int *)(boolean + 1);
  if (iVar2 == 0x10) {
    if ((**(char **)(boolean + 2) == '\x0e') &&
       (iVar6 = Literal::geti32((Literal *)(*(char **)(boolean + 2) + 0x10)), iVar6 == 0)) {
      return (Expression *)boolean[1].type.id;
    }
  }
  else if (iVar2 == 5) {
    if (**(char **)(boolean + 2) == '\x0e') {
      pLVar10 = (Literal *)(*(char **)(boolean + 2) + 0x10);
      bVar4 = Literal::isSignedMin(pLVar10);
      if (bVar4) {
LAB_00ad9293:
        *(undefined4 *)(boolean + 1) = 7;
        bVar4 = Literal::isSignedMin(pLVar10);
        if (bVar4) {
          Literal::makeSignedMax(&local_48,(Type)0x2);
          Literal::operator=(pLVar10,&local_48);
          pLVar10 = &local_48;
        }
        else {
          Literal::abs(&local_78,(int)pLVar10);
          Literal::makeOne(&local_60,(Type)0x2);
          Literal::sub(&local_48,&local_78,&local_60);
          Literal::operator=(pLVar10,&local_48);
          Literal::~Literal(&local_48);
          Literal::~Literal(&local_60);
          pLVar10 = &local_78;
        }
        Literal::~Literal(pLVar10);
        return boolean;
      }
      Literal::abs(&local_48,(int)pLVar10);
      uVar5 = Literal::geti32(&local_48);
      if (uVar5 == 0) {
        Literal::~Literal(&local_48);
      }
      else {
        Literal::~Literal(&local_48);
        if ((uVar5 & uVar5 - 1) == 0) goto LAB_00ad9293;
      }
    }
  }
  else if (iVar2 == 8) {
    pEVar8 = optimizeBoolean(this,(Expression *)boolean[1].type.id);
    boolean[1].type.id = (uintptr_t)pEVar8;
    pEVar8 = optimizeBoolean(this,*(Expression **)(boolean + 2));
    *(Expression **)(boolean + 2) = pEVar8;
  }
  else if (((iVar2 == 1) && (pcVar3 = (char *)boolean[1].type.id, *pcVar3 == '\x0e')) &&
          (iVar6 = Literal::geti32((Literal *)(pcVar3 + 0x10)), iVar6 == 0)) {
    return *(Expression **)(boolean + 2);
  }
  pEVar8 = Properties::getSignExtValue(boolean);
  if (pEVar8 != (Expression *)0x0) {
    bits = Properties::getSignExtBits(boolean);
    boolean = makeZeroExt(this,pEVar8,bits);
  }
  return boolean;
}

Assistant:

Expression* optimizeBoolean(Expression* boolean) {
    // TODO use a general getFallthroughs
    if (auto* unary = boolean->dynCast<Unary>()) {
      if (unary) {
        if (unary->op == EqZInt32) {
          auto* unary2 = unary->value->dynCast<Unary>();
          if (unary2 && unary2->op == EqZInt32) {
            // double eqz
            return unary2->value;
          }
          if (auto* binary = unary->value->dynCast<Binary>()) {
            // !(x <=> y)   ==>   x <!=> y
            auto op = invertBinaryOp(binary->op);
            if (op != InvalidBinary) {
              binary->op = op;
              return binary;
            }
          }
        }
      }
    } else if (auto* binary = boolean->dynCast<Binary>()) {
      if (binary->op == SubInt32) {
        if (auto* c = binary->left->dynCast<Const>()) {
          if (c->value.geti32() == 0) {
            // bool(0 - x)   ==>   bool(x)
            return binary->right;
          }
        }
      } else if (binary->op == OrInt32) {
        // an or flowing into a boolean context can consider each input as
        // boolean
        binary->left = optimizeBoolean(binary->left);
        binary->right = optimizeBoolean(binary->right);
      } else if (binary->op == NeInt32) {
        if (auto* c = binary->right->dynCast<Const>()) {
          // x != 0 is just x if it's used as a bool
          if (c->value.geti32() == 0) {
            return binary->left;
          }
          // TODO: Perhaps use it for separate final pass???
          // x != -1   ==>    x ^ -1
          // if (num->value.geti32() == -1) {
          //   binary->op = XorInt32;
          //   return binary;
          // }
        }
      } else if (binary->op == RemSInt32) {
        // bool(i32(x) % C_pot)  ==>  bool(x & (C_pot - 1))
        // bool(i32(x) % min_s)  ==>  bool(x & max_s)
        if (auto* c = binary->right->dynCast<Const>()) {
          if (c->value.isSignedMin() ||
              Bits::isPowerOf2(c->value.abs().geti32())) {
            binary->op = AndInt32;
            if (c->value.isSignedMin()) {
              c->value = Literal::makeSignedMax(Type::i32);
            } else {
              c->value = c->value.abs().sub(Literal::makeOne(Type::i32));
            }
            return binary;
          }
        }
      }
      if (auto* ext = Properties::getSignExtValue(binary)) {
        // use a cheaper zero-extent, we just care about the boolean value
        // anyhow
        return makeZeroExt(ext, Properties::getSignExtBits(binary));
      }
    } else if (auto* block = boolean->dynCast<Block>()) {
      if (block->type == Type::i32 && block->list.size() > 0) {
        block->list.back() = optimizeBoolean(block->list.back());
      }
    } else if (auto* iff = boolean->dynCast<If>()) {
      if (iff->type == Type::i32) {
        iff->ifTrue = optimizeBoolean(iff->ifTrue);
        iff->ifFalse = optimizeBoolean(iff->ifFalse);
      }
    } else if (auto* select = boolean->dynCast<Select>()) {
      select->ifTrue = optimizeBoolean(select->ifTrue);
      select->ifFalse = optimizeBoolean(select->ifFalse);
    } else if (auto* tryy = boolean->dynCast<Try>()) {
      if (tryy->type == Type::i32) {
        tryy->body = optimizeBoolean(tryy->body);
        for (Index i = 0; i < tryy->catchBodies.size(); i++) {
          tryy->catchBodies[i] = optimizeBoolean(tryy->catchBodies[i]);
        }
      }
    }
    // TODO: recurse into br values?
    return boolean;
  }